

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.cpp
# Opt level: O2

int Lodtalk::ByteString::stSplitVariableNames(InterpreterProxy *interpreter)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Oop OVar3;
  string local_40;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  iVar2 = (**interpreter->_vptr_InterpreterProxy)(interpreter);
  getString_abi_cxx11_(&local_40,(ByteString *)CONCAT44(extraout_var_00,iVar1));
  OVar3 = splitVariableNames((VMContext *)CONCAT44(extraout_var_01,iVar2),&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,OVar3.field_0);
  return iVar1;
}

Assistant:

int ByteString::stSplitVariableNames(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    Oop self = interpreter->getReceiver();
    Oop result = splitVariableNames(interpreter->getContext(), reinterpret_cast<ByteString*> (self.pointer)->getString());
    return interpreter->returnOop(result);
}